

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerStep *
sqlite3TriggerInsertStep
          (Parse *pParse,Token *pTableName,IdList *pColumn,Select *pSelect,u8 orconf,Upsert *pUpsert
          ,char *zStart,char *zEnd)

{
  sqlite3 *db;
  TriggerStep *pTVar1;
  Select *pSVar2;
  
  db = pParse->db;
  pTVar1 = triggerStepAllocate(pParse,'\x7f',pTableName,zStart,zEnd);
  if (pTVar1 == (TriggerStep *)0x0) {
    sqlite3IdListDelete(db,pColumn);
    if (pUpsert != (Upsert *)0x0) {
      upsertDelete(db,pUpsert);
    }
  }
  else {
    if (pParse->eParseMode < 2) {
      pSVar2 = sqlite3SelectDup(db,pSelect,1);
    }
    else {
      pSVar2 = pSelect;
      pSelect = (Select *)0x0;
    }
    pTVar1->pSelect = pSVar2;
    pTVar1->pIdList = pColumn;
    pTVar1->pUpsert = pUpsert;
    pTVar1->orconf = orconf;
    if (pUpsert != (Upsert *)0x0) {
      sqlite3HasExplicitNulls(pParse,pUpsert->pUpsertTarget);
    }
  }
  if (pSelect != (Select *)0x0) {
    clearSelect(db,pSelect,1);
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerInsertStep(
  Parse *pParse,      /* Parser */
  Token *pTableName,  /* Name of the table into which we insert */
  IdList *pColumn,    /* List of columns in pTableName to insert into */
  Select *pSelect,    /* A SELECT statement that supplies values */
  u8 orconf,          /* The conflict algorithm (OE_Abort, OE_Replace, etc.) */
  Upsert *pUpsert,    /* ON CONFLICT clauses for upsert */
  const char *zStart, /* Start of SQL text */
  const char *zEnd    /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  assert(pSelect != 0 || db->mallocFailed);

  pTriggerStep = triggerStepAllocate(pParse, TK_INSERT, pTableName,zStart,zEnd);
  if( pTriggerStep ){
    if( IN_RENAME_OBJECT ){
      pTriggerStep->pSelect = pSelect;
      pSelect = 0;
    }else{
      pTriggerStep->pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
    }
    pTriggerStep->pIdList = pColumn;
    pTriggerStep->pUpsert = pUpsert;
    pTriggerStep->orconf = orconf;
    if( pUpsert ){
      sqlite3HasExplicitNulls(pParse, pUpsert->pUpsertTarget);
    }
  }else{
    testcase( pColumn );
    sqlite3IdListDelete(db, pColumn);
    testcase( pUpsert );
    sqlite3UpsertDelete(db, pUpsert);
  }
  sqlite3SelectDelete(db, pSelect);

  return pTriggerStep;
}